

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_xcore.c
# Opt level: O0

void print_insn_detail(cs_insn *ins)

{
  uint8_t *puVar1;
  int iVar2;
  cs_detail *pcVar3;
  anon_union_1480_8_3a70395c_for_cs_detail_6 *paVar4;
  char *pcVar5;
  cs_xcore_op *op;
  int i;
  cs_xcore *xcore;
  cs_insn *ins_local;
  
  if (ins->detail != (cs_detail *)0x0) {
    pcVar3 = ins->detail;
    paVar4 = &pcVar3->field_6;
    if ((paVar4->x86).prefix[0] != '\0') {
      printf("\top_count: %u\n",(ulong)(paVar4->x86).prefix[0]);
    }
    for (op._4_4_ = 0; (int)op._4_4_ < (int)(uint)(paVar4->x86).prefix[0]; op._4_4_ = op._4_4_ + 1)
    {
      puVar1 = pcVar3->groups + (long)(int)op._4_4_ * 0x10 + 0x12;
      iVar2 = *(int *)puVar1;
      if (iVar2 == 1) {
        pcVar5 = cs_reg_name(handle,*(uint *)(puVar1 + 4));
        printf("\t\toperands[%u].type: REG = %s\n",(ulong)op._4_4_,pcVar5);
      }
      else if (iVar2 == 2) {
        printf("\t\toperands[%u].type: IMM = 0x%x\n",(ulong)op._4_4_,(ulong)*(uint *)(puVar1 + 4));
      }
      else if (iVar2 == 3) {
        printf("\t\toperands[%u].type: MEM\n",(ulong)op._4_4_);
        if (puVar1[4] != '\0') {
          pcVar5 = cs_reg_name(handle,(uint)puVar1[4]);
          printf("\t\t\toperands[%u].mem.base: REG = %s\n",(ulong)op._4_4_,pcVar5);
        }
        if (puVar1[5] != '\0') {
          pcVar5 = cs_reg_name(handle,(uint)puVar1[5]);
          printf("\t\t\toperands[%u].mem.index: REG = %s\n",(ulong)op._4_4_,pcVar5);
        }
        if (*(int *)(puVar1 + 8) != 0) {
          printf("\t\t\toperands[%u].mem.disp: 0x%x\n",(ulong)op._4_4_,(ulong)*(uint *)(puVar1 + 8))
          ;
        }
        if (*(int *)(puVar1 + 0xc) != 1) {
          printf("\t\t\toperands[%u].mem.direct: -1\n",(ulong)op._4_4_);
        }
      }
    }
    printf("\n");
  }
  return;
}

Assistant:

static void print_insn_detail(cs_insn *ins)
{
	cs_xcore *xcore;
	int i;

	// detail can be NULL on "data" instruction if SKIPDATA option is turned ON
	if (ins->detail == NULL)
		return;

	xcore = &(ins->detail->xcore);
	if (xcore->op_count)
		printf("\top_count: %u\n", xcore->op_count);

	for (i = 0; i < xcore->op_count; i++) {
		cs_xcore_op *op = &(xcore->operands[i]);
		switch((int)op->type) {
			default:
				break;
			case XCORE_OP_REG:
				printf("\t\toperands[%u].type: REG = %s\n", i, cs_reg_name(handle, op->reg));
				break;
			case XCORE_OP_IMM:
				printf("\t\toperands[%u].type: IMM = 0x%x\n", i, op->imm);
				break;
			case XCORE_OP_MEM:
				printf("\t\toperands[%u].type: MEM\n", i);
				if (op->mem.base != XCORE_REG_INVALID)
					printf("\t\t\toperands[%u].mem.base: REG = %s\n",
							i, cs_reg_name(handle, op->mem.base));
				if (op->mem.index != XCORE_REG_INVALID)
					printf("\t\t\toperands[%u].mem.index: REG = %s\n",
							i, cs_reg_name(handle, op->mem.index));
				if (op->mem.disp != 0)
					printf("\t\t\toperands[%u].mem.disp: 0x%x\n", i, op->mem.disp);
				if (op->mem.direct != 1)
					printf("\t\t\toperands[%u].mem.direct: -1\n", i);


				break;
		}
	}

	printf("\n");
}